

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::DXFImporter::CanRead(DXFImporter *this,string *filename,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  ulong uVar2;
  char *pcStack_88;
  char *pTokens [4];
  string local_58;
  string *local_38;
  string *extension;
  IOSystem *pIStack_28;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *filename_local;
  DXFImporter *this_local;
  
  extension._7_1_ = checkSig;
  pIStack_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)filename;
  filename_local = (string *)this;
  BaseImporter::GetExtension(&local_58,filename);
  local_38 = &local_58;
  bVar1 = std::operator==(&local_58,"dxf");
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && ((extension._7_1_ & 1) == 0)) {
      this_local._7_1_ = false;
    }
    else {
      pTokens[1] = "ENDSEC";
      pTokens[2] = "BLOCKS";
      pcStack_88 = "SECTION";
      pTokens[0] = "HEADER";
      this_local._7_1_ =
           BaseImporter::SearchFileHeaderForToken
                     (pIStack_28,(string *)pIOHandler_local,&pcStack_88,4,0x20,false,false);
    }
  }
  pTokens[3]._0_4_ = 1;
  std::__cxx11::string::~string((string *)&local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DXFImporter::CanRead( const std::string& filename, IOSystem* pIOHandler, bool checkSig ) const {
    const std::string& extension = GetExtension( filename );
    if ( extension == desc.mFileExtensions ) {
        return true;
    }

    if ( extension.empty() || checkSig ) {
        const char *pTokens[] = { "SECTION", "HEADER", "ENDSEC", "BLOCKS" };
        return BaseImporter::SearchFileHeaderForToken(pIOHandler, filename, pTokens, 4, 32 );
    }

    return false;
}